

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_properties.cpp
# Opt level: O0

bool __thiscall ON_3dmRevisionHistory::Read(ON_3dmRevisionHistory *this,ON_BinaryArchive *file)

{
  bool local_21;
  int local_20;
  int iStack_1c;
  bool rc;
  int minor_version;
  int major_version;
  ON_BinaryArchive *file_local;
  ON_3dmRevisionHistory *this_local;
  
  _minor_version = file;
  file_local = (ON_BinaryArchive *)this;
  operator=(this,&Empty);
  iStack_1c = 0;
  local_20 = 0;
  local_21 = ON_BinaryArchive::Read3dmChunkVersion
                       (_minor_version,&stack0xffffffffffffffe4,&local_20);
  if ((local_21) && (iStack_1c == 1)) {
    local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_sCreatedBy);
    if (local_21) {
      local_21 = ON_BinaryArchive::ReadTime(_minor_version,&this->m_create_time);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadString(_minor_version,&this->m_sLastEditedBy);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadTime(_minor_version,&this->m_last_edit_time);
    }
    if (local_21 != false) {
      local_21 = ON_BinaryArchive::ReadInt(_minor_version,&this->m_revision_count);
    }
  }
  return local_21;
}

Assistant:

bool ON_3dmRevisionHistory::Read( ON_BinaryArchive& file )
{
  *this = ON_3dmRevisionHistory::Empty;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.Read3dmChunkVersion( &major_version, &minor_version );
  if ( rc && major_version == 1 ) {
    rc = file.ReadString( m_sCreatedBy );
    if (rc) rc = file.ReadTime( m_create_time );
    if (rc) rc = file.ReadString( m_sLastEditedBy );
    if (rc) rc = file.ReadTime(m_last_edit_time );
    if (rc) rc = file.ReadInt( &m_revision_count );
  }
  return rc;
}